

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

char * glcts::anon_unknown_0::GetInput140c6
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  pointer puVar1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x180);
  puVar1 = (in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = 0x80;
  puVar1[3] = '?';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '@';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '@';
  puVar1[0x23] = '@';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = 0x80;
  puVar1[0x33] = '@';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = '\0';
  puVar1[0x3f] = '\0';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = 0xa0;
  puVar1[0x43] = '@';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = '\0';
  puVar1[0x47] = '\0';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = '\0';
  puVar1[0x51] = '\0';
  puVar1[0x52] = 0xc0;
  puVar1[0x53] = '@';
  puVar1[0x54] = '\0';
  puVar1[0x55] = '\0';
  puVar1[0x56] = 0xe0;
  puVar1[0x57] = '@';
  puVar1[0x58] = '\0';
  puVar1[0x59] = '\0';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = 'A';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\x10';
  puVar1[0x5f] = 'A';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = ' ';
  puVar1[99] = 'A';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = '0';
  puVar1[0x67] = 'A';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = '\0';
  puVar1[0x6b] = '\0';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = '\0';
  puVar1[0x71] = '\0';
  puVar1[0x72] = '@';
  puVar1[0x73] = 'A';
  puVar1[0x74] = '\0';
  puVar1[0x75] = '\0';
  puVar1[0x76] = 'P';
  puVar1[0x77] = 'A';
  puVar1[0x78] = '\0';
  puVar1[0x79] = '\0';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = '\0';
  puVar1[0x7d] = '\0';
  puVar1[0x7e] = '\0';
  puVar1[0x7f] = '\0';
  puVar1[0x80] = '\0';
  puVar1[0x81] = '\0';
  puVar1[0x82] = '`';
  puVar1[0x83] = 'A';
  puVar1[0x84] = '\0';
  puVar1[0x85] = '\0';
  puVar1[0x86] = 'p';
  puVar1[0x87] = 'A';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = '\0';
  puVar1[0x91] = '\0';
  puVar1[0x92] = 0x80;
  puVar1[0x93] = 'A';
  puVar1[0x94] = '\0';
  puVar1[0x95] = '\0';
  puVar1[0x96] = 0x88;
  puVar1[0x97] = 'A';
  puVar1[0x98] = '\0';
  puVar1[0x99] = '\0';
  puVar1[0x9a] = '\0';
  puVar1[0x9b] = '\0';
  puVar1[0x9c] = '\0';
  puVar1[0x9d] = '\0';
  puVar1[0x9e] = '\0';
  puVar1[0x9f] = '\0';
  puVar1[0xa0] = '\0';
  puVar1[0xa1] = '\0';
  puVar1[0xa2] = 0x90;
  puVar1[0xa3] = 'A';
  puVar1[0xa4] = '\0';
  puVar1[0xa5] = '\0';
  puVar1[0xa6] = 0x98;
  puVar1[0xa7] = 'A';
  puVar1[0xa8] = '\0';
  puVar1[0xa9] = '\0';
  puVar1[0xaa] = 0xa0;
  puVar1[0xab] = 'A';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0xb0] = '\0';
  puVar1[0xb1] = '\0';
  puVar1[0xb2] = 0xa8;
  puVar1[0xb3] = 'A';
  puVar1[0xb4] = '\0';
  puVar1[0xb5] = '\0';
  puVar1[0xb6] = 0xb0;
  puVar1[0xb7] = 'A';
  puVar1[0xb8] = '\0';
  puVar1[0xb9] = '\0';
  puVar1[0xba] = 0xb8;
  puVar1[0xbb] = 'A';
  puVar1[0xbc] = '\0';
  puVar1[0xbd] = '\0';
  puVar1[0xbe] = '\0';
  puVar1[0xbf] = '\0';
  puVar1[0xc0] = '\0';
  puVar1[0xc1] = '\0';
  puVar1[0xc2] = 0xc0;
  puVar1[0xc3] = 'A';
  puVar1[0xc4] = '\0';
  puVar1[0xc5] = '\0';
  puVar1[0xc6] = 200;
  puVar1[199] = 'A';
  puVar1[200] = '\0';
  puVar1[0xc9] = '\0';
  puVar1[0xca] = 0xd0;
  puVar1[0xcb] = 'A';
  puVar1[0xcc] = '\0';
  puVar1[0xcd] = '\0';
  puVar1[0xce] = '\0';
  puVar1[0xcf] = '\0';
  puVar1[0xd0] = '\0';
  puVar1[0xd1] = '\0';
  puVar1[0xd2] = 0xd8;
  puVar1[0xd3] = 'A';
  puVar1[0xd4] = '\0';
  puVar1[0xd5] = '\0';
  puVar1[0xd6] = 0xe0;
  puVar1[0xd7] = 'A';
  puVar1[0xd8] = '\0';
  puVar1[0xd9] = '\0';
  puVar1[0xda] = 0xe8;
  puVar1[0xdb] = 'A';
  puVar1[0xdc] = '\0';
  puVar1[0xdd] = '\0';
  puVar1[0xde] = '\0';
  puVar1[0xdf] = '\0';
  puVar1[0xe0] = '\0';
  puVar1[0xe1] = '\0';
  puVar1[0xe2] = 0xf0;
  puVar1[0xe3] = 'A';
  puVar1[0xe4] = '\0';
  puVar1[0xe5] = '\0';
  puVar1[0xe6] = 0xf8;
  puVar1[0xe7] = 'A';
  puVar1[0xe8] = '\0';
  puVar1[0xe9] = '\0';
  puVar1[0xea] = '\0';
  puVar1[0xeb] = 'B';
  puVar1[0xec] = '\0';
  puVar1[0xed] = '\0';
  puVar1[0xee] = '\0';
  puVar1[0xef] = '\0';
  puVar1[0xf0] = '\0';
  puVar1[0xf1] = '\0';
  puVar1[0xf2] = '\x04';
  puVar1[0xf3] = 'B';
  puVar1[0xf4] = '\0';
  puVar1[0xf5] = '\0';
  puVar1[0xf6] = '\b';
  puVar1[0xf7] = 'B';
  puVar1[0xf8] = '\0';
  puVar1[0xf9] = '\0';
  puVar1[0xfa] = '\f';
  puVar1[0xfb] = 'B';
  puVar1[0xfc] = '\0';
  puVar1[0xfd] = '\0';
  puVar1[0xfe] = '\0';
  puVar1[0xff] = '\0';
  puVar1[0x100] = '\0';
  puVar1[0x101] = '\0';
  puVar1[0x102] = '\x10';
  puVar1[0x103] = 'B';
  puVar1[0x104] = '\0';
  puVar1[0x105] = '\0';
  puVar1[0x106] = '\x14';
  puVar1[0x107] = 'B';
  puVar1[0x108] = '\0';
  puVar1[0x109] = '\0';
  puVar1[0x10a] = '\x18';
  puVar1[0x10b] = 'B';
  puVar1[0x10c] = '\0';
  puVar1[0x10d] = '\0';
  puVar1[0x10e] = '\x1c';
  puVar1[0x10f] = 'B';
  puVar1[0x110] = '\0';
  puVar1[0x111] = '\0';
  puVar1[0x112] = ' ';
  puVar1[0x113] = 'B';
  puVar1[0x114] = '\0';
  puVar1[0x115] = '\0';
  puVar1[0x116] = '$';
  puVar1[0x117] = 'B';
  puVar1[0x118] = '\0';
  puVar1[0x119] = '\0';
  puVar1[0x11a] = '(';
  puVar1[0x11b] = 'B';
  puVar1[0x11c] = '\0';
  puVar1[0x11d] = '\0';
  puVar1[0x11e] = ',';
  puVar1[0x11f] = 'B';
  puVar1[0x120] = '\0';
  puVar1[0x121] = '\0';
  puVar1[0x122] = '0';
  puVar1[0x123] = 'B';
  puVar1[0x124] = '\0';
  puVar1[0x125] = '\0';
  puVar1[0x126] = '4';
  puVar1[0x127] = 'B';
  puVar1[0x128] = '\0';
  puVar1[0x129] = '\0';
  puVar1[0x12a] = '8';
  puVar1[299] = 'B';
  puVar1[300] = '\0';
  puVar1[0x12d] = '\0';
  puVar1[0x12e] = '<';
  puVar1[0x12f] = 'B';
  puVar1[0x130] = '\0';
  puVar1[0x131] = '\0';
  puVar1[0x132] = '@';
  puVar1[0x133] = 'B';
  puVar1[0x134] = '\0';
  puVar1[0x135] = '\0';
  puVar1[0x136] = 'D';
  puVar1[0x137] = 'B';
  puVar1[0x138] = '\0';
  puVar1[0x139] = '\0';
  puVar1[0x13a] = 'H';
  puVar1[0x13b] = 'B';
  puVar1[0x13c] = '\0';
  puVar1[0x13d] = '\0';
  puVar1[0x13e] = 'L';
  puVar1[0x13f] = 'B';
  puVar1[0x140] = '\0';
  puVar1[0x141] = '\0';
  puVar1[0x142] = 'P';
  puVar1[0x143] = 'B';
  puVar1[0x144] = '\0';
  puVar1[0x145] = '\0';
  puVar1[0x146] = 0x88;
  puVar1[0x147] = 'B';
  puVar1[0x148] = '\0';
  puVar1[0x149] = '\0';
  puVar1[0x14a] = 0x8a;
  puVar1[0x14b] = 'B';
  puVar1[0x14c] = '\0';
  puVar1[0x14d] = '\0';
  puVar1[0x14e] = 0x8c;
  puVar1[0x14f] = 'B';
  puVar1[0x150] = '\0';
  puVar1[0x151] = '\0';
  puVar1[0x152] = '`';
  puVar1[0x153] = 'B';
  puVar1[0x154] = '\0';
  puVar1[0x155] = '\0';
  puVar1[0x156] = 0x90;
  puVar1[0x157] = 'B';
  puVar1[0x158] = '\0';
  puVar1[0x159] = '\0';
  puVar1[0x15a] = 0x92;
  puVar1[0x15b] = 'B';
  puVar1[0x15c] = '\0';
  puVar1[0x15d] = '\0';
  puVar1[0x15e] = 0x94;
  puVar1[0x15f] = 'B';
  puVar1[0x160] = '\0';
  puVar1[0x161] = '\0';
  puVar1[0x162] = 'p';
  puVar1[0x163] = 'B';
  puVar1[0x164] = '\0';
  puVar1[0x165] = '\0';
  puVar1[0x166] = 0x98;
  puVar1[0x167] = 'B';
  puVar1[0x168] = '\0';
  puVar1[0x169] = '\0';
  puVar1[0x16a] = 0x9a;
  puVar1[0x16b] = 'B';
  puVar1[0x16c] = '\0';
  puVar1[0x16d] = '\0';
  puVar1[0x16e] = 0x9c;
  puVar1[0x16f] = 'B';
  puVar1[0x170] = '\0';
  puVar1[0x171] = '\0';
  puVar1[0x172] = 0x80;
  puVar1[0x173] = 'B';
  puVar1[0x174] = '\0';
  puVar1[0x175] = '\0';
  puVar1[0x176] = 0xa0;
  puVar1[0x177] = 'B';
  puVar1[0x178] = '\0';
  puVar1[0x179] = '\0';
  puVar1[0x17a] = 0xa2;
  puVar1[0x17b] = 'B';
  puVar1[0x17c] = '\0';
  puVar1[0x17d] = '\0';
  puVar1[0x17e] = 0xa4;
  puVar1[0x17f] = 'B';
  return (char *)puVar1;
}

Assistant:

const char* GetInput140c6(std::vector<GLubyte>& in_data)
{
	in_data.resize(96 * 4);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	fp[0]	 = 1.0f;
	fp[1]	 = 0.0f;
	fp[2]	 = 0.0f;
	fp[3]	 = 0.0f;
	fp[4]	 = 2.0f;
	fp[5]	 = 0.0f;
	fp[6]	 = 0.0f;
	fp[7]	 = 0.0f;
	fp[8]	 = 3.0f;
	fp[9]	 = 0.0f;
	fp[10]	= 0.0f;
	fp[11]	= 0.0f;
	fp[12]	= 4.0f;
	fp[13]	= 0.0f;
	fp[14]	= 0.0f;
	fp[15]	= 0.0f;
	fp[16]	= 5.0f;
	fp[17]	= 0.0f;
	fp[18]	= 0.0f;
	fp[19]	= 0.0f;
	fp[20]	= 6.0f;
	fp[21]	= 7.0f;
	fp[22]	= 8.0f;
	fp[23]	= 9.0f;
	fp[24]	= 10.0f;
	fp[25]	= 11.0f;
	fp[26]	= 0.0f;
	fp[27]	= 0.0f;
	fp[28]	= 12.0f;
	fp[29]	= 13.0f;
	fp[30]	= 0.0f;
	fp[31]	= 0.0f;
	fp[32]	= 14.0f;
	fp[33]	= 15.0f;
	fp[34]	= 0.0f;
	fp[35]	= 0.0f;
	fp[36]	= 16.0f;
	fp[37]	= 17.0f;
	fp[38]	= 0.0f;
	fp[39]	= 0.0f;
	fp[40]	= 18.0f;
	fp[41]	= 19.0f;
	fp[42]	= 20.0f;
	fp[43]	= 0.0f;
	fp[44]	= 21.0f;
	fp[45]	= 22.0f;
	fp[46]	= 23.0f;
	fp[47]	= 0.0f;
	fp[48]	= 24.0f;
	fp[49]	= 25.0f;
	fp[50]	= 26.0f;
	fp[51]	= 0.0f;
	fp[52]	= 27.0f;
	fp[53]	= 28.0f;
	fp[54]	= 29.0f;
	fp[55]	= 0.0f;
	fp[56]	= 30.0f;
	fp[57]	= 31.0f;
	fp[58]	= 32.0f;
	fp[59]	= 0.0f;
	fp[60]	= 33.0f;
	fp[61]	= 34.0f;
	fp[62]	= 35.0f;
	fp[63]	= 0.0f;
	fp[64]	= 36.0f;
	fp[65]	= 37.0f;
	fp[66]	= 38.0f;
	fp[67]	= 39.0f;
	fp[68]	= 40.0f;
	fp[69]	= 41.0f;
	fp[70]	= 42.0f;
	fp[71]	= 43.0f;
	fp[72]	= 44.0f;
	fp[73]	= 45.0f;
	fp[74]	= 46.0f;
	fp[75]	= 47.0f;
	fp[76]	= 48.0f;
	fp[77]	= 49.0f;
	fp[78]	= 50.0f;
	fp[79]	= 51.0f;
	fp[80]	= 52.0f;
	fp[81]	= 68.0f;
	fp[82]	= 69.0f;
	fp[83]	= 70.0f;
	fp[84]	= 56.0f;
	fp[85]	= 72.0f;
	fp[86]	= 73.0f;
	fp[87]	= 74.0f;
	fp[88]	= 60.0f;
	fp[89]	= 76.0f;
	fp[90]	= 77.0f;
	fp[91]	= 78.0f;
	fp[92]	= 64.0f;
	fp[93]	= 80.0f;
	fp[94]	= 81.0f;
	fp[95]	= 82.0f;

	return NL "layout(std140, binding = 0) buffer Input {" NL "  float data0[2];" NL "  float data1[3];" NL
			  "  vec2 data2;" NL "  vec2 data3;" NL "  mat2 data4[2];" NL "  mat3 data5[2];" NL "  mat4 data6[2];" NL
			  "} g_input;" NL "layout(std140, binding = 1) buffer Output {" NL "  float data0[2];" NL
			  "  float data1[3];" NL "  vec2 data2;" NL "  vec2 data3;" NL "  mat2 data4[2];" NL "  mat3 data5[2];" NL
			  "  mat4 data6[2];" NL "} g_output;" NL "void main() {" NL
			  "  for (int i = 0; i < g_input.data0.length(); ++i) g_output.data0[i] = g_input.data0[i];" NL
			  "  for (int i = 0; i < g_input.data1.length(); ++i) g_output.data1[i] = g_input.data1[i];" NL
			  "  g_output.data2 = g_input.data2;" NL "  g_output.data3 = g_input.data3;" NL
			  "  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];" NL
			  "  for (int i = 0; i < g_input.data5.length(); ++i) g_output.data5[i] = g_input.data5[i];" NL
			  "  for (int i = 0; i < g_input.data6.length(); ++i) g_output.data6[i] = g_input.data6[i];" NL "}";
}